

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::avx::ConeCurveMiIntersectorK<8,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  Geometry *pGVar9;
  long lVar10;
  RTCFilterFunctionN p_Var11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  float fVar54;
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  RayK<4> *pRVar87;
  byte bVar88;
  Scene *pSVar89;
  undefined4 uVar90;
  bool bVar91;
  uint uVar92;
  ulong uVar93;
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  float fVar101;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar109;
  float fVar110;
  float fVar112;
  float fVar113;
  float fVar114;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar111;
  float fVar115;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar116;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  float fVar122;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar123;
  undefined1 auVar121 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  float fVar130;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  float fVar143;
  float fVar144;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar153;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  float fVar171;
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar172;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  float fVar182;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar192;
  undefined1 auVar193 [32];
  float fVar194;
  float fVar198;
  float fVar199;
  float fVar200;
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar205 [32];
  undefined1 auVar206 [64];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [64];
  undefined1 auVar211 [32];
  undefined1 auVar212 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<8> hit;
  undefined1 local_650 [16];
  RayK<4> *local_640;
  Scene *local_638;
  RTCFilterFunctionNArguments local_630;
  undefined1 local_600 [32];
  undefined1 local_5e0 [16];
  undefined1 auStack_5d0 [16];
  undefined1 (*local_5c0) [16];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined4 uStack_524;
  RTCHitN local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined4 local_4e0;
  undefined4 uStack_4dc;
  undefined4 uStack_4d8;
  undefined4 uStack_4d4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [8];
  float fStack_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  undefined4 uStack_144;
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [32];
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  
  pSVar89 = context->scene;
  uVar92 = line->sharedGeomID;
  uVar1 = (line->v0).field_0.i[0];
  pGVar9 = (pSVar89->geometries).items[uVar92].ptr;
  lVar10 = *(long *)&pGVar9[1].time_range.upper;
  p_Var11 = pGVar9[1].intersectionFilterN;
  uVar2 = (line->v0).field_0.i[1];
  uVar3 = (line->v0).field_0.i[4];
  uVar4 = (line->v0).field_0.i[5];
  auVar95._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar3 * (long)p_Var11);
  auVar95._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar1 * (long)p_Var11);
  auVar104._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar4 * (long)p_Var11);
  auVar104._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar2 * (long)p_Var11);
  uVar5 = (line->v0).field_0.i[2];
  uVar6 = (line->v0).field_0.i[3];
  uVar7 = (line->v0).field_0.i[6];
  auVar119._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar7 * (long)p_Var11);
  auVar119._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar5 * (long)p_Var11);
  uVar8 = (line->v0).field_0.i[7];
  auVar124._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar8 * (long)p_Var11);
  auVar124._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)uVar6 * (long)p_Var11);
  auVar166._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar3 + 1) * (long)p_Var11);
  auVar166._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar1 + 1) * (long)p_Var11);
  auVar173._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar4 + 1) * (long)p_Var11);
  auVar173._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar2 + 1) * (long)p_Var11);
  auVar184 = vunpcklps_avx(auVar95,auVar119);
  auVar158 = vunpckhps_avx(auVar95,auVar119);
  auVar196 = vunpcklps_avx(auVar104,auVar124);
  auVar174 = vunpckhps_avx(auVar104,auVar124);
  auVar52 = vunpcklps_avx(auVar184,auVar196);
  auVar209 = vunpckhps_avx(auVar184,auVar196);
  auVar53 = vunpcklps_avx(auVar158,auVar174);
  auVar211 = vunpckhps_avx(auVar158,auVar174);
  auVar96._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar7 + 1) * (long)p_Var11);
  auVar96._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar5 + 1) * (long)p_Var11);
  auVar105._16_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar8 + 1) * (long)p_Var11);
  auVar105._0_16_ = *(undefined1 (*) [16])(lVar10 + (ulong)(uVar6 + 1) * (long)p_Var11);
  auVar184 = vunpcklps_avx(auVar166,auVar96);
  auVar158 = vunpckhps_avx(auVar166,auVar96);
  auVar196 = vunpcklps_avx(auVar173,auVar105);
  auVar174 = vunpckhps_avx(auVar173,auVar105);
  auVar104 = vunpcklps_avx(auVar184,auVar196);
  auVar95 = vunpckhps_avx(auVar184,auVar196);
  auVar105 = vunpcklps_avx(auVar158,auVar174);
  auVar96 = vunpckhps_avx(auVar158,auVar174);
  auVar94 = vpcmpeqd_avx(auVar96._0_16_,auVar96._0_16_);
  auVar102 = vpcmpeqd_avx(auVar94,*(undefined1 (*) [16])(line->primIDs).field_0.field_1.vl);
  auVar94 = vpcmpeqd_avx(auVar94,*(undefined1 (*) [16])((long)&(line->primIDs).field_0 + 0x10));
  local_230 = vshufps_avx(ZEXT416(uVar92),ZEXT416(uVar92),0);
  local_240 = local_230;
  local_260 = *(float *)(ray + k * 4 + 0x40);
  local_280 = *(float *)(ray + k * 4 + 0x50);
  local_2a0 = *(float *)(ray + k * 4 + 0x60);
  auVar97._16_16_ = auVar94;
  auVar97._0_16_ = auVar102;
  auVar94 = ZEXT416((uint)(local_260 * local_260 + local_280 * local_280 + local_2a0 * local_2a0));
  auVar94 = vshufps_avx(auVar94,auVar94,0);
  auVar98._16_16_ = auVar94;
  auVar98._0_16_ = auVar94;
  auVar158 = vrcpps_avx(auVar98);
  fVar101 = auVar158._0_4_;
  fVar109 = auVar158._4_4_;
  auVar174._4_4_ = fVar109 * auVar94._4_4_;
  auVar174._0_4_ = fVar101 * auVar94._0_4_;
  fVar110 = auVar158._8_4_;
  auVar174._8_4_ = fVar110 * auVar94._8_4_;
  fVar111 = auVar158._12_4_;
  auVar174._12_4_ = fVar111 * auVar94._12_4_;
  fVar112 = auVar158._16_4_;
  auVar174._16_4_ = fVar112 * auVar94._0_4_;
  fVar113 = auVar158._20_4_;
  auVar174._20_4_ = fVar113 * auVar94._4_4_;
  fVar114 = auVar158._24_4_;
  auVar174._24_4_ = fVar114 * auVar94._8_4_;
  auVar174._28_4_ = auVar94._12_4_;
  auVar120._8_4_ = 0x3f800000;
  auVar120._0_8_ = 0x3f8000003f800000;
  auVar120._12_4_ = 0x3f800000;
  auVar120._16_4_ = 0x3f800000;
  auVar120._20_4_ = 0x3f800000;
  auVar120._24_4_ = 0x3f800000;
  auVar120._28_4_ = 0x3f800000;
  auVar174 = vsubps_avx(auVar120,auVar174);
  auVar205._4_4_ = (auVar52._4_4_ + auVar104._4_4_) * 0.5;
  auVar205._0_4_ = (auVar52._0_4_ + auVar104._0_4_) * 0.5;
  auVar205._8_4_ = (auVar52._8_4_ + auVar104._8_4_) * 0.5;
  auVar205._12_4_ = (auVar52._12_4_ + auVar104._12_4_) * 0.5;
  auVar205._16_4_ = (auVar52._16_4_ + auVar104._16_4_) * 0.5;
  auVar205._20_4_ = (auVar52._20_4_ + auVar104._20_4_) * 0.5;
  auVar205._24_4_ = (auVar52._24_4_ + auVar104._24_4_) * 0.5;
  auVar205._28_4_ = auVar52._28_4_ + auVar104._28_4_;
  auVar184._4_4_ = (auVar95._4_4_ + auVar209._4_4_) * 0.5;
  auVar184._0_4_ = (auVar95._0_4_ + auVar209._0_4_) * 0.5;
  auVar184._8_4_ = (auVar95._8_4_ + auVar209._8_4_) * 0.5;
  auVar184._12_4_ = (auVar95._12_4_ + auVar209._12_4_) * 0.5;
  auVar184._16_4_ = (auVar95._16_4_ + auVar209._16_4_) * 0.5;
  auVar184._20_4_ = (auVar95._20_4_ + auVar209._20_4_) * 0.5;
  auVar184._24_4_ = (auVar95._24_4_ + auVar209._24_4_) * 0.5;
  auVar184._28_4_ = auVar95._28_4_ + auVar209._28_4_;
  auVar196._4_4_ = (auVar53._4_4_ + auVar105._4_4_) * 0.5;
  auVar196._0_4_ = (auVar53._0_4_ + auVar105._0_4_) * 0.5;
  auVar196._8_4_ = (auVar53._8_4_ + auVar105._8_4_) * 0.5;
  auVar196._12_4_ = (auVar53._12_4_ + auVar105._12_4_) * 0.5;
  auVar196._16_4_ = (auVar53._16_4_ + auVar105._16_4_) * 0.5;
  auVar196._20_4_ = (auVar53._20_4_ + auVar105._20_4_) * 0.5;
  auVar196._24_4_ = (auVar53._24_4_ + auVar105._24_4_) * 0.5;
  auVar196._28_4_ = 0x3f000000;
  fVar171 = *(float *)(ray + k * 4 + 0x10);
  auVar126._4_4_ = fVar171;
  auVar126._0_4_ = fVar171;
  auVar126._8_4_ = fVar171;
  auVar126._12_4_ = fVar171;
  auVar126._16_4_ = fVar171;
  auVar126._20_4_ = fVar171;
  auVar126._24_4_ = fVar171;
  auVar126._28_4_ = fVar171;
  auVar184 = vsubps_avx(auVar184,auVar126);
  fVar192 = *(float *)(ray + k * 4 + 0x20);
  auVar154._4_4_ = fVar192;
  auVar154._0_4_ = fVar192;
  auVar154._8_4_ = fVar192;
  auVar154._12_4_ = fVar192;
  auVar154._16_4_ = fVar192;
  auVar154._20_4_ = fVar192;
  auVar154._24_4_ = fVar192;
  auVar154._28_4_ = fVar192;
  auVar196 = vsubps_avx(auVar196,auVar154);
  fStack_5a4 = auVar184._28_4_ + auVar196._28_4_;
  fVar153 = *(float *)(ray + k * 4);
  auVar125._4_4_ = fVar153;
  auVar125._0_4_ = fVar153;
  auVar125._8_4_ = fVar153;
  auVar125._12_4_ = fVar153;
  auVar125._16_4_ = fVar153;
  auVar125._20_4_ = fVar153;
  auVar125._24_4_ = fVar153;
  auVar125._28_4_ = fVar153;
  auVar205 = vsubps_avx(auVar205,auVar125);
  fVar115 = auVar205._28_4_ + fStack_5a4;
  fVar116 = (local_260 * auVar205._0_4_ + local_280 * auVar184._0_4_ + auVar196._0_4_ * local_2a0) *
            (fVar101 + fVar101 * auVar174._0_4_);
  fVar122 = (local_260 * auVar205._4_4_ + local_280 * auVar184._4_4_ + auVar196._4_4_ * local_2a0) *
            (fVar109 + fVar109 * auVar174._4_4_);
  fStack_5b8 = (local_260 * auVar205._8_4_ + local_280 * auVar184._8_4_ + auVar196._8_4_ * local_2a0
               ) * (fVar110 + fVar110 * auVar174._8_4_);
  fStack_5b4 = (local_260 * auVar205._12_4_ +
               local_280 * auVar184._12_4_ + auVar196._12_4_ * local_2a0) *
               (fVar111 + fVar111 * auVar174._12_4_);
  fStack_5b0 = (local_260 * auVar205._16_4_ +
               local_280 * auVar184._16_4_ + auVar196._16_4_ * local_2a0) *
               (fVar112 + fVar112 * auVar174._16_4_);
  fStack_5ac = (local_260 * auVar205._20_4_ +
               local_280 * auVar184._20_4_ + auVar196._20_4_ * local_2a0) *
               (fVar113 + fVar113 * auVar174._20_4_);
  fStack_5a8 = (local_260 * auVar205._24_4_ +
               local_280 * auVar184._24_4_ + auVar196._24_4_ * local_2a0) *
               (fVar114 + fVar114 * auVar174._24_4_);
  auVar99._0_4_ = fVar153 + local_260 * fVar116;
  auVar99._4_4_ = fVar153 + local_260 * fVar122;
  auVar99._8_4_ = fVar153 + local_260 * fStack_5b8;
  auVar99._12_4_ = fVar153 + local_260 * fStack_5b4;
  auVar99._16_4_ = fVar153 + local_260 * fStack_5b0;
  auVar99._20_4_ = fVar153 + local_260 * fStack_5ac;
  auVar99._24_4_ = fVar153 + local_260 * fStack_5a8;
  auVar99._28_4_ = fVar153 + auVar158._28_4_ + auVar174._28_4_;
  auVar127._0_4_ = fVar171 + local_280 * fVar116;
  auVar127._4_4_ = fVar171 + local_280 * fVar122;
  auVar127._8_4_ = fVar171 + local_280 * fStack_5b8;
  auVar127._12_4_ = fVar171 + local_280 * fStack_5b4;
  auVar127._16_4_ = fVar171 + local_280 * fStack_5b0;
  auVar127._20_4_ = fVar171 + local_280 * fStack_5ac;
  auVar127._24_4_ = fVar171 + local_280 * fStack_5a8;
  auVar127._28_4_ = fVar171 + fVar115;
  auVar106._0_4_ = fVar192 + local_2a0 * fVar116;
  auVar106._4_4_ = fVar192 + local_2a0 * fVar122;
  auVar106._8_4_ = fVar192 + local_2a0 * fStack_5b8;
  auVar106._12_4_ = fVar192 + local_2a0 * fStack_5b4;
  auVar106._16_4_ = fVar192 + local_2a0 * fStack_5b0;
  auVar106._20_4_ = fVar192 + local_2a0 * fStack_5ac;
  auVar106._24_4_ = fVar192 + local_2a0 * fStack_5a8;
  auVar106._28_4_ = fVar192 + fVar115;
  local_3a0 = vsubps_avx(auVar95,auVar209);
  local_3c0 = vsubps_avx(auVar105,auVar53);
  fVar171 = local_3c0._0_4_;
  fVar113 = local_3c0._4_4_;
  fVar17 = local_3c0._8_4_;
  fVar24 = local_3c0._12_4_;
  fVar31 = local_3c0._16_4_;
  fVar38 = local_3c0._20_4_;
  fVar45 = local_3c0._24_4_;
  fVar192 = local_3a0._0_4_;
  fVar114 = local_3a0._4_4_;
  fVar18 = local_3a0._8_4_;
  fVar25 = local_3a0._12_4_;
  fVar32 = local_3a0._16_4_;
  fVar39 = local_3a0._20_4_;
  fVar46 = local_3a0._24_4_;
  local_420 = vsubps_avx(auVar104,auVar52);
  fVar101 = local_420._0_4_;
  fVar115 = local_420._4_4_;
  fVar19 = local_420._8_4_;
  fVar26 = local_420._12_4_;
  fVar33 = local_420._16_4_;
  fVar40 = local_420._20_4_;
  fVar47 = local_420._24_4_;
  local_440._0_4_ = fVar101 * fVar101 + fVar192 * fVar192 + fVar171 * fVar171;
  local_440._4_4_ = fVar115 * fVar115 + fVar114 * fVar114 + fVar113 * fVar113;
  fStack_438 = fVar19 * fVar19 + fVar18 * fVar18 + fVar17 * fVar17;
  fStack_434 = fVar26 * fVar26 + fVar25 * fVar25 + fVar24 * fVar24;
  fStack_430 = fVar33 * fVar33 + fVar32 * fVar32 + fVar31 * fVar31;
  fStack_42c = fVar40 * fVar40 + fVar39 * fVar39 + fVar38 * fVar38;
  fStack_428 = fVar47 * fVar47 + fVar46 * fVar46 + fVar45 * fVar45;
  local_3e0 = vsubps_avx(auVar127,auVar209);
  local_400 = vsubps_avx(auVar106,auVar53);
  fVar109 = local_400._0_4_;
  fVar13 = local_400._4_4_;
  fVar20 = local_400._8_4_;
  fVar27 = local_400._12_4_;
  fVar34 = local_400._16_4_;
  fVar41 = local_400._20_4_;
  fVar48 = local_400._24_4_;
  fVar110 = local_3e0._0_4_;
  fVar14 = local_3e0._4_4_;
  fVar21 = local_3e0._8_4_;
  fVar28 = local_3e0._12_4_;
  fVar35 = local_3e0._16_4_;
  fVar42 = local_3e0._20_4_;
  fVar49 = local_3e0._24_4_;
  fVar123 = auVar127._28_4_ + fVar153 + fStack_5a4;
  local_600 = vsubps_avx(auVar99,auVar52);
  fVar111 = local_600._0_4_;
  fVar15 = local_600._4_4_;
  fVar22 = local_600._8_4_;
  fVar29 = local_600._12_4_;
  fVar36 = local_600._16_4_;
  fVar43 = local_600._20_4_;
  fVar50 = local_600._24_4_;
  fVar194 = fVar101 * fVar111 + fVar192 * fVar110 + fVar171 * fVar109;
  fVar198 = fVar115 * fVar15 + fVar114 * fVar14 + fVar113 * fVar13;
  fVar199 = fVar19 * fVar22 + fVar18 * fVar21 + fVar17 * fVar20;
  fVar200 = fVar26 * fVar29 + fVar25 * fVar28 + fVar24 * fVar27;
  fVar201 = fVar33 * fVar36 + fVar32 * fVar35 + fVar31 * fVar34;
  fVar202 = fVar40 * fVar43 + fVar39 * fVar42 + fVar38 * fVar41;
  fVar203 = fVar47 * fVar50 + fVar46 * fVar49 + fVar45 * fVar48;
  fVar204 = auVar127._28_4_ + fVar123;
  fVar123 = auVar127._28_4_ + fVar123;
  auVar193._0_4_ = fVar101 * local_260 + local_280 * fVar192 + fVar171 * local_2a0;
  auVar193._4_4_ = fVar115 * local_260 + local_280 * fVar114 + fVar113 * local_2a0;
  auVar193._8_4_ = fVar19 * local_260 + local_280 * fVar18 + fVar17 * local_2a0;
  auVar193._12_4_ = fVar26 * local_260 + local_280 * fVar25 + fVar24 * local_2a0;
  auVar193._16_4_ = fVar33 * local_260 + local_280 * fVar32 + fVar31 * local_2a0;
  auVar193._20_4_ = fVar40 * local_260 + local_280 * fVar39 + fVar38 * local_2a0;
  auVar193._24_4_ = fVar47 * local_260 + local_280 * fVar46 + fVar45 * local_2a0;
  auVar193._28_4_ = auVar127._28_4_ + fVar123;
  auVar158 = vsubps_avx(auVar211,auVar96);
  fVar112 = auVar158._0_4_;
  fVar16 = auVar158._4_4_;
  fVar23 = auVar158._8_4_;
  fVar30 = auVar158._12_4_;
  fVar37 = auVar158._16_4_;
  fVar44 = auVar158._20_4_;
  fVar51 = auVar158._24_4_;
  local_2c0 = (float)local_440._0_4_ + fVar112 * fVar112;
  fStack_2bc = (float)local_440._4_4_ + fVar16 * fVar16;
  fStack_2b8 = fStack_438 + fVar23 * fVar23;
  fStack_2b4 = fStack_434 + fVar30 * fVar30;
  fStack_2b0 = fStack_430 + fVar37 * fVar37;
  fStack_2ac = fStack_42c + fVar44 * fVar44;
  fStack_2a8 = fStack_428 + fVar51 * fVar51;
  fVar130 = (float)local_440._0_4_ * (float)local_440._0_4_;
  fVar137 = (float)local_440._4_4_ * (float)local_440._4_4_;
  local_160._4_4_ = fVar137;
  local_160._0_4_ = fVar130;
  fVar138 = fStack_438 * fStack_438;
  fStack_158 = fVar138;
  fVar139 = fStack_434 * fStack_434;
  fStack_154 = fVar139;
  fVar140 = fStack_430 * fStack_430;
  fStack_150 = fVar140;
  fVar141 = fStack_42c * fStack_42c;
  fStack_14c = fVar141;
  fVar142 = fStack_428 * fStack_428;
  fStack_148 = fVar142;
  uStack_144 = local_2a0;
  auVar209._4_4_ = fVar137 * (local_260 * fVar15 + local_280 * fVar14 + local_2a0 * fVar13);
  auVar209._0_4_ = fVar130 * (local_260 * fVar111 + local_280 * fVar110 + local_2a0 * fVar109);
  auVar209._8_4_ = fVar138 * (local_260 * fVar22 + local_280 * fVar21 + local_2a0 * fVar20);
  auVar209._12_4_ = fVar139 * (local_260 * fVar29 + local_280 * fVar28 + local_2a0 * fVar27);
  auVar209._16_4_ = fVar140 * (local_260 * fVar36 + local_280 * fVar35 + local_2a0 * fVar34);
  auVar209._20_4_ = fVar141 * (local_260 * fVar43 + local_280 * fVar42 + local_2a0 * fVar41);
  auVar209._24_4_ = fVar142 * (local_260 * fVar50 + local_280 * fVar49 + local_2a0 * fVar48);
  auVar209._28_4_ = auVar127._28_4_ + auVar127._28_4_ + fVar123;
  fVar54 = local_400._28_4_;
  auVar52._4_4_ = fStack_2bc * auVar193._4_4_ * fVar198;
  auVar52._0_4_ = local_2c0 * auVar193._0_4_ * fVar194;
  auVar52._8_4_ = fStack_2b8 * auVar193._8_4_ * fVar199;
  auVar52._12_4_ = fStack_2b4 * auVar193._12_4_ * fVar200;
  auVar52._16_4_ = fStack_2b0 * auVar193._16_4_ * fVar201;
  auVar52._20_4_ = fStack_2ac * auVar193._20_4_ * fVar202;
  auVar52._24_4_ = fStack_2a8 * auVar193._24_4_ * fVar203;
  auVar52._28_4_ = fVar54;
  auVar174 = vsubps_avx(auVar209,auVar52);
  fStack_424 = fVar153 + fVar153 + fStack_5a4;
  fVar153 = auVar211._0_4_;
  fVar143 = (float)local_440._0_4_ * fVar153;
  fVar123 = auVar211._4_4_;
  fVar147 = (float)local_440._4_4_ * fVar123;
  auVar53._4_4_ = fVar147;
  auVar53._0_4_ = fVar143;
  fVar161 = auVar211._8_4_;
  fVar148 = fStack_438 * fVar161;
  auVar53._8_4_ = fVar148;
  fVar162 = auVar211._12_4_;
  fVar149 = fStack_434 * fVar162;
  auVar53._12_4_ = fVar149;
  fVar163 = auVar211._16_4_;
  fVar150 = fStack_430 * fVar163;
  auVar53._16_4_ = fVar150;
  fVar164 = auVar211._20_4_;
  fVar151 = fStack_42c * fVar164;
  auVar53._20_4_ = fVar151;
  fVar165 = auVar211._24_4_;
  fVar152 = fStack_428 * fVar165;
  auVar53._24_4_ = fVar152;
  auVar53._28_4_ = fVar54;
  auVar155._0_4_ = fVar143 * fVar112 * auVar193._0_4_ + auVar174._0_4_;
  auVar155._4_4_ = fVar147 * fVar16 * auVar193._4_4_ + auVar174._4_4_;
  auVar155._8_4_ = fVar148 * fVar23 * auVar193._8_4_ + auVar174._8_4_;
  auVar155._12_4_ = fVar149 * fVar30 * auVar193._12_4_ + auVar174._12_4_;
  auVar155._16_4_ = fVar150 * fVar37 * auVar193._16_4_ + auVar174._16_4_;
  auVar155._20_4_ = fVar151 * fVar44 * auVar193._20_4_ + auVar174._20_4_;
  auVar155._24_4_ = fVar152 * fVar51 * auVar193._24_4_ + auVar174._24_4_;
  auVar155._28_4_ = local_3a0._28_4_ + auVar174._28_4_;
  auVar211._4_4_ = fVar137 * (fVar15 * fVar15 + fVar14 * fVar14 + fVar13 * fVar13);
  auVar211._0_4_ = fVar130 * (fVar111 * fVar111 + fVar110 * fVar110 + fVar109 * fVar109);
  auVar211._8_4_ = fVar138 * (fVar22 * fVar22 + fVar21 * fVar21 + fVar20 * fVar20);
  auVar211._12_4_ = fVar139 * (fVar29 * fVar29 + fVar28 * fVar28 + fVar27 * fVar27);
  auVar211._16_4_ = fVar140 * (fVar36 * fVar36 + fVar35 * fVar35 + fVar34 * fVar34);
  auVar211._20_4_ = fVar141 * (fVar43 * fVar43 + fVar42 * fVar42 + fVar41 * fVar41);
  auVar211._24_4_ = fVar142 * (fVar50 * fVar50 + fVar49 * fVar49 + fVar48 * fVar48);
  auVar211._28_4_ = auVar174._28_4_;
  auVar55._4_4_ = fStack_2bc * fVar198 * fVar198;
  auVar55._0_4_ = local_2c0 * fVar194 * fVar194;
  auVar55._8_4_ = fStack_2b8 * fVar199 * fVar199;
  auVar55._12_4_ = fStack_2b4 * fVar200 * fVar200;
  auVar55._16_4_ = fStack_2b0 * fVar201 * fVar201;
  auVar55._20_4_ = fStack_2ac * fVar202 * fVar202;
  auVar55._24_4_ = fStack_2a8 * fVar203 * fVar203;
  auVar55._28_4_ = local_2a0 + local_2a0 + auVar127._28_4_;
  auVar174 = vsubps_avx(auVar211,auVar55);
  auVar56._4_4_ = fVar198 * (fVar16 + fVar16);
  auVar56._0_4_ = fVar194 * (fVar112 + fVar112);
  auVar56._8_4_ = fVar199 * (fVar23 + fVar23);
  auVar56._12_4_ = fVar200 * (fVar30 + fVar30);
  auVar56._16_4_ = fVar201 * (fVar37 + fVar37);
  auVar56._20_4_ = fVar202 * (fVar44 + fVar44);
  auVar56._24_4_ = fVar203 * (fVar51 + fVar51);
  auVar56._28_4_ = auVar158._28_4_ + auVar158._28_4_;
  auVar158 = vsubps_avx(auVar56,auVar53);
  fVar144 = auVar158._28_4_;
  fVar182 = auVar193._0_4_ * auVar193._0_4_;
  fVar186 = auVar193._4_4_ * auVar193._4_4_;
  fVar187 = auVar193._8_4_ * auVar193._8_4_;
  fVar188 = auVar193._12_4_ * auVar193._12_4_;
  fVar189 = auVar193._16_4_ * auVar193._16_4_;
  fVar190 = auVar193._20_4_ * auVar193._20_4_;
  fVar191 = auVar193._24_4_ * auVar193._24_4_;
  auVar57._4_4_ = fStack_2bc * fVar186;
  auVar57._0_4_ = local_2c0 * fVar182;
  auVar57._8_4_ = fStack_2b8 * fVar187;
  auVar57._12_4_ = fStack_2b4 * fVar188;
  auVar57._16_4_ = fStack_2b0 * fVar189;
  auVar57._20_4_ = fStack_2ac * fVar190;
  auVar57._24_4_ = fStack_2a8 * fVar191;
  auVar57._28_4_ = fVar144;
  auVar184 = vsubps_avx(_local_160,auVar57);
  auVar58._4_4_ = auVar184._4_4_ * (auVar174._4_4_ + fVar147 * auVar158._4_4_);
  auVar58._0_4_ = auVar184._0_4_ * (auVar174._0_4_ + fVar143 * auVar158._0_4_);
  auVar58._8_4_ = auVar184._8_4_ * (auVar174._8_4_ + fVar148 * auVar158._8_4_);
  auVar58._12_4_ = auVar184._12_4_ * (auVar174._12_4_ + fVar149 * auVar158._12_4_);
  auVar58._16_4_ = auVar184._16_4_ * (auVar174._16_4_ + fVar150 * auVar158._16_4_);
  auVar58._20_4_ = auVar184._20_4_ * (auVar174._20_4_ + fVar151 * auVar158._20_4_);
  auVar58._24_4_ = auVar184._24_4_ * (auVar174._24_4_ + fVar152 * auVar158._24_4_);
  auVar58._28_4_ = auVar174._28_4_ + fVar144;
  auVar158._4_4_ = auVar155._4_4_ * auVar155._4_4_;
  auVar158._0_4_ = auVar155._0_4_ * auVar155._0_4_;
  auVar158._8_4_ = auVar155._8_4_ * auVar155._8_4_;
  auVar158._12_4_ = auVar155._12_4_ * auVar155._12_4_;
  auVar158._16_4_ = auVar155._16_4_ * auVar155._16_4_;
  auVar158._20_4_ = auVar155._20_4_ * auVar155._20_4_;
  auVar158._24_4_ = auVar155._24_4_ * auVar155._24_4_;
  auVar158._28_4_ = fVar144;
  auVar174 = vsubps_avx(auVar158,auVar58);
  auVar158 = vcmpps_avx(auVar174,ZEXT832(0) << 0x20,5);
  auVar196 = auVar158 & ~auVar97;
  if ((((((((auVar196 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar196 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar196 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar196 >> 0x7f,0) != '\0') ||
        (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar196 >> 0xbf,0) != '\0') ||
      (auVar196 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar196[0x1f] < '\0')
  {
    auVar196 = vandnps_avx(auVar97,auVar158);
    auVar211 = vsubps_avx(auVar99,auVar104);
    auVar95 = vsubps_avx(auVar127,auVar95);
    auVar52 = vsubps_avx(auVar106,auVar105);
    fVar172 = auVar211._0_4_ * fVar101 + auVar52._0_4_ * fVar171 + auVar95._0_4_ * fVar192;
    fVar176 = auVar211._4_4_ * fVar115 + auVar52._4_4_ * fVar113 + auVar95._4_4_ * fVar114;
    fVar177 = auVar211._8_4_ * fVar19 + auVar52._8_4_ * fVar17 + auVar95._8_4_ * fVar18;
    fVar178 = auVar211._12_4_ * fVar26 + auVar52._12_4_ * fVar24 + auVar95._12_4_ * fVar25;
    fVar179 = auVar211._16_4_ * fVar33 + auVar52._16_4_ * fVar31 + auVar95._16_4_ * fVar32;
    fVar180 = auVar211._20_4_ * fVar40 + auVar52._20_4_ * fVar38 + auVar95._20_4_ * fVar39;
    fVar181 = auVar211._24_4_ * fVar47 + auVar52._24_4_ * fVar45 + auVar95._24_4_ * fVar46;
    auVar174 = vsqrtps_avx(auVar174);
    auVar158 = vrcpps_avx(auVar184);
    fVar144 = auVar158._0_4_;
    auVar207._0_4_ = auVar184._0_4_ * fVar144;
    fVar143 = auVar158._4_4_;
    auVar207._4_4_ = auVar184._4_4_ * fVar143;
    fVar147 = auVar158._8_4_;
    auVar207._8_4_ = auVar184._8_4_ * fVar147;
    fVar148 = auVar158._12_4_;
    auVar207._12_4_ = auVar184._12_4_ * fVar148;
    fVar149 = auVar158._16_4_;
    auVar207._16_4_ = auVar184._16_4_ * fVar149;
    fVar150 = auVar158._20_4_;
    auVar207._20_4_ = auVar184._20_4_ * fVar150;
    fVar151 = auVar158._24_4_;
    auVar207._24_4_ = auVar184._24_4_ * fVar151;
    auVar207._28_4_ = 0;
    auVar131._8_4_ = 0x3f800000;
    auVar131._0_8_ = 0x3f8000003f800000;
    auVar131._12_4_ = 0x3f800000;
    auVar131._16_4_ = 0x3f800000;
    auVar131._20_4_ = 0x3f800000;
    auVar131._24_4_ = 0x3f800000;
    auVar131._28_4_ = 0x3f800000;
    auVar205 = vsubps_avx(auVar131,auVar207);
    auVar121._8_4_ = 0x7fffffff;
    auVar121._0_8_ = 0x7fffffff7fffffff;
    auVar121._12_4_ = 0x7fffffff;
    auVar121._16_4_ = 0x7fffffff;
    auVar121._20_4_ = 0x7fffffff;
    auVar121._24_4_ = 0x7fffffff;
    auVar121._28_4_ = 0x7fffffff;
    fVar144 = auVar205._0_4_ * fVar144 + fVar144;
    fVar143 = auVar205._4_4_ * fVar143 + fVar143;
    fVar147 = auVar205._8_4_ * fVar147 + fVar147;
    fVar148 = auVar205._12_4_ * fVar148 + fVar148;
    fVar149 = auVar205._16_4_ * fVar149 + fVar149;
    fVar150 = auVar205._20_4_ * fVar150 + fVar150;
    fVar151 = auVar205._24_4_ * fVar151 + fVar151;
    fVar152 = auVar205._28_4_ + auVar158._28_4_;
    auVar158 = vandps_avx(auVar184,auVar121);
    auVar167._8_4_ = 0x219392ef;
    auVar167._0_8_ = 0x219392ef219392ef;
    auVar167._12_4_ = 0x219392ef;
    auVar167._16_4_ = 0x219392ef;
    auVar167._20_4_ = 0x219392ef;
    auVar167._24_4_ = 0x219392ef;
    auVar167._28_4_ = 0x219392ef;
    auVar158 = vcmpps_avx(auVar158,auVar167,2);
    uVar93 = CONCAT44(auVar155._4_4_,auVar155._0_4_);
    auVar168._0_8_ = uVar93 ^ 0x8000000080000000;
    auVar168._8_4_ = -auVar155._8_4_;
    auVar168._12_4_ = -auVar155._12_4_;
    auVar168._16_4_ = -auVar155._16_4_;
    auVar168._20_4_ = -auVar155._20_4_;
    auVar168._24_4_ = -auVar155._24_4_;
    auVar168._28_4_ = -auVar155._28_4_;
    auVar184 = vsubps_avx(auVar168,auVar174);
    auVar174 = vsubps_avx(auVar174,auVar155);
    auVar59._4_4_ = auVar184._4_4_ * fVar143;
    auVar59._0_4_ = auVar184._0_4_ * fVar144;
    auVar59._8_4_ = auVar184._8_4_ * fVar147;
    auVar59._12_4_ = auVar184._12_4_ * fVar148;
    auVar59._16_4_ = auVar184._16_4_ * fVar149;
    auVar59._20_4_ = auVar184._20_4_ * fVar150;
    auVar59._24_4_ = auVar184._24_4_ * fVar151;
    auVar59._28_4_ = auVar155._28_4_;
    auVar60._4_4_ = auVar174._4_4_ * fVar143;
    auVar60._0_4_ = auVar174._0_4_ * fVar144;
    auVar60._8_4_ = auVar174._8_4_ * fVar147;
    auVar60._12_4_ = auVar174._12_4_ * fVar148;
    auVar60._16_4_ = auVar174._16_4_ * fVar149;
    auVar60._20_4_ = auVar174._20_4_ * fVar150;
    auVar60._24_4_ = auVar174._24_4_ * fVar151;
    auVar60._28_4_ = fVar152;
    auVar100._8_4_ = 0xff800000;
    auVar100._0_8_ = 0xff800000ff800000;
    auVar100._12_4_ = 0xff800000;
    auVar100._16_4_ = 0xff800000;
    auVar100._20_4_ = 0xff800000;
    auVar100._24_4_ = 0xff800000;
    auVar100._28_4_ = 0xff800000;
    auVar174 = vblendvps_avx(auVar59,auVar100,auVar158);
    auVar128._8_4_ = 0x7f800000;
    auVar128._0_8_ = 0x7f8000007f800000;
    auVar128._12_4_ = 0x7f800000;
    auVar128._16_4_ = 0x7f800000;
    auVar128._20_4_ = 0x7f800000;
    auVar128._24_4_ = 0x7f800000;
    auVar128._28_4_ = 0x7f800000;
    auVar184 = vblendvps_avx(auVar60,auVar128,auVar158);
    auVar208._0_4_ = fVar194 + auVar193._0_4_ * auVar174._0_4_;
    auVar208._4_4_ = fVar198 + auVar193._4_4_ * auVar174._4_4_;
    auVar208._8_4_ = fVar199 + auVar193._8_4_ * auVar174._8_4_;
    auVar208._12_4_ = fVar200 + auVar193._12_4_ * auVar174._12_4_;
    auVar208._16_4_ = fVar201 + auVar193._16_4_ * auVar174._16_4_;
    auVar208._20_4_ = fVar202 + auVar193._20_4_ * auVar174._20_4_;
    auVar208._24_4_ = fVar203 + auVar193._24_4_ * auVar174._24_4_;
    auVar208._28_4_ = fVar204 + fVar152;
    auVar158 = vcmpps_avx(auVar208,ZEXT832(0) << 0x20,6);
    auVar205 = vcmpps_avx(auVar208,_local_440,1);
    auVar158 = vandps_avx(auVar205,auVar158);
    auVar158 = vandps_avx(auVar158,auVar196);
    local_460 = vblendvps_avx(auVar128,auVar174,auVar158);
    local_480._0_4_ = fVar194 + auVar193._0_4_ * auVar184._0_4_;
    local_480._4_4_ = fVar198 + auVar193._4_4_ * auVar184._4_4_;
    fStack_478 = fVar199 + auVar193._8_4_ * auVar184._8_4_;
    fStack_474 = fVar200 + auVar193._12_4_ * auVar184._12_4_;
    fStack_470 = fVar201 + auVar193._16_4_ * auVar184._16_4_;
    fStack_46c = fVar202 + auVar193._20_4_ * auVar184._20_4_;
    fStack_468 = fVar203 + auVar193._24_4_ * auVar184._24_4_;
    register0x000013dc = fVar204 + local_460._28_4_;
    auVar158 = vcmpps_avx(_local_480,ZEXT832(0) << 0x20,6);
    auVar174 = vcmpps_avx(_local_480,_local_440,1);
    auVar158 = vandps_avx(auVar174,auVar158);
    auVar158 = vandps_avx(auVar158,auVar196);
    auVar184 = vblendvps_avx(auVar100,auVar184,auVar158);
    auVar209 = vrcpps_avx(auVar193);
    fVar144 = auVar209._0_4_;
    fVar143 = auVar209._4_4_;
    auVar61._4_4_ = auVar193._4_4_ * fVar143;
    auVar61._0_4_ = auVar193._0_4_ * fVar144;
    fVar147 = auVar209._8_4_;
    auVar61._8_4_ = auVar193._8_4_ * fVar147;
    fVar148 = auVar209._12_4_;
    auVar61._12_4_ = auVar193._12_4_ * fVar148;
    fVar149 = auVar209._16_4_;
    auVar61._16_4_ = auVar193._16_4_ * fVar149;
    fVar150 = auVar209._20_4_;
    auVar61._20_4_ = auVar193._20_4_ * fVar150;
    fVar151 = auVar209._24_4_;
    auVar61._24_4_ = auVar193._24_4_ * fVar151;
    auVar61._28_4_ = auVar158._28_4_;
    auVar158 = vsubps_avx(auVar131,auVar61);
    fVar144 = fVar144 + fVar144 * auVar158._0_4_;
    fVar143 = fVar143 + fVar143 * auVar158._4_4_;
    fVar147 = fVar147 + fVar147 * auVar158._8_4_;
    fVar148 = fVar148 + fVar148 * auVar158._12_4_;
    fVar149 = fVar149 + fVar149 * auVar158._16_4_;
    fVar150 = fVar150 + fVar150 * auVar158._20_4_;
    fVar151 = fVar151 + fVar151 * auVar158._24_4_;
    auVar62._4_4_ = auVar193._4_4_ * fVar15;
    auVar62._0_4_ = auVar193._0_4_ * fVar111;
    auVar62._8_4_ = auVar193._8_4_ * fVar22;
    auVar62._12_4_ = auVar193._12_4_ * fVar29;
    auVar62._16_4_ = auVar193._16_4_ * fVar36;
    auVar62._20_4_ = auVar193._20_4_ * fVar43;
    auVar62._24_4_ = auVar193._24_4_ * fVar50;
    auVar62._28_4_ = auVar158._28_4_;
    auVar63._4_4_ = fVar198 * local_260;
    auVar63._0_4_ = fVar194 * local_260;
    auVar63._8_4_ = fVar199 * local_260;
    auVar63._12_4_ = fVar200 * local_260;
    auVar63._16_4_ = fVar201 * local_260;
    auVar63._20_4_ = fVar202 * local_260;
    auVar63._24_4_ = fVar203 * local_260;
    auVar63._28_4_ = auVar174._28_4_;
    auVar158 = vsubps_avx(auVar62,auVar63);
    auVar64._4_4_ = auVar193._4_4_ * fVar14;
    auVar64._0_4_ = auVar193._0_4_ * fVar110;
    auVar64._8_4_ = auVar193._8_4_ * fVar21;
    auVar64._12_4_ = auVar193._12_4_ * fVar28;
    auVar64._16_4_ = auVar193._16_4_ * fVar35;
    auVar64._20_4_ = auVar193._20_4_ * fVar42;
    auVar64._24_4_ = auVar193._24_4_ * fVar49;
    auVar64._28_4_ = auVar174._28_4_;
    auVar65._4_4_ = local_280 * fVar198;
    auVar65._0_4_ = local_280 * fVar194;
    auVar65._8_4_ = local_280 * fVar199;
    auVar65._12_4_ = local_280 * fVar200;
    auVar65._16_4_ = local_280 * fVar201;
    auVar65._20_4_ = local_280 * fVar202;
    auVar65._24_4_ = local_280 * fVar203;
    auVar65._28_4_ = auVar205._28_4_;
    auVar174 = vsubps_avx(auVar64,auVar65);
    auVar66._4_4_ = auVar193._4_4_ * fVar13;
    auVar66._0_4_ = auVar193._0_4_ * fVar109;
    auVar66._8_4_ = auVar193._8_4_ * fVar20;
    auVar66._12_4_ = auVar193._12_4_ * fVar27;
    auVar66._16_4_ = auVar193._16_4_ * fVar34;
    auVar66._20_4_ = auVar193._20_4_ * fVar41;
    auVar66._24_4_ = auVar193._24_4_ * fVar48;
    auVar66._28_4_ = auVar205._28_4_;
    auVar67._4_4_ = fVar198 * local_2a0;
    auVar67._0_4_ = fVar194 * local_2a0;
    auVar67._8_4_ = fVar199 * local_2a0;
    auVar67._12_4_ = fVar200 * local_2a0;
    auVar67._16_4_ = fVar201 * local_2a0;
    auVar67._20_4_ = fVar202 * local_2a0;
    auVar67._24_4_ = fVar203 * local_2a0;
    auVar67._28_4_ = 0x3f800000;
    auVar205 = vsubps_avx(auVar66,auVar67);
    fVar152 = auVar174._28_4_;
    auVar132._0_4_ =
         auVar158._0_4_ * auVar158._0_4_ +
         auVar174._0_4_ * auVar174._0_4_ + auVar205._0_4_ * auVar205._0_4_;
    auVar132._4_4_ =
         auVar158._4_4_ * auVar158._4_4_ +
         auVar174._4_4_ * auVar174._4_4_ + auVar205._4_4_ * auVar205._4_4_;
    auVar132._8_4_ =
         auVar158._8_4_ * auVar158._8_4_ +
         auVar174._8_4_ * auVar174._8_4_ + auVar205._8_4_ * auVar205._8_4_;
    auVar132._12_4_ =
         auVar158._12_4_ * auVar158._12_4_ +
         auVar174._12_4_ * auVar174._12_4_ + auVar205._12_4_ * auVar205._12_4_;
    auVar132._16_4_ =
         auVar158._16_4_ * auVar158._16_4_ +
         auVar174._16_4_ * auVar174._16_4_ + auVar205._16_4_ * auVar205._16_4_;
    auVar132._20_4_ =
         auVar158._20_4_ * auVar158._20_4_ +
         auVar174._20_4_ * auVar174._20_4_ + auVar205._20_4_ * auVar205._20_4_;
    auVar132._24_4_ =
         auVar158._24_4_ * auVar158._24_4_ +
         auVar174._24_4_ * auVar174._24_4_ + auVar205._24_4_ * auVar205._24_4_;
    auVar132._28_4_ = auVar158._28_4_ + fVar152 + auVar205._28_4_;
    auVar68._4_4_ = fVar186 * fVar123 * fVar123;
    auVar68._0_4_ = fVar182 * fVar153 * fVar153;
    auVar68._8_4_ = fVar187 * fVar161 * fVar161;
    auVar68._12_4_ = fVar188 * fVar162 * fVar162;
    auVar68._16_4_ = fVar189 * fVar163 * fVar163;
    auVar68._20_4_ = fVar190 * fVar164 * fVar164;
    auVar68._24_4_ = fVar191 * fVar165 * fVar165;
    auVar68._28_4_ = auVar158._28_4_;
    auVar158 = vcmpps_avx(auVar132,auVar68,1);
    auVar69._4_4_ = fVar143 * -fVar198;
    auVar69._0_4_ = fVar144 * -fVar194;
    auVar69._8_4_ = fVar147 * -fVar199;
    auVar69._12_4_ = fVar148 * -fVar200;
    auVar69._16_4_ = fVar149 * -fVar201;
    auVar69._20_4_ = fVar150 * -fVar202;
    auVar69._24_4_ = fVar151 * -fVar203;
    auVar69._28_4_ = -fVar204;
    auVar174 = vblendvps_avx(auVar128,auVar69,auVar158);
    auVar145._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->leftExists & 0xfffffff0));
    auVar145._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->leftExists & 0xf) << 4));
    auVar158 = vandnps_avx(auVar145,auVar196);
    local_340 = vblendvps_avx(auVar128,auVar174,auVar158);
    auVar133._16_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + (line->rightExists & 0xfffffff0));
    auVar133._0_16_ = *(undefined1 (*) [16])(mm_lookupmask_ps + ((line->rightExists & 0xf) << 4));
    auVar70._4_4_ = auVar193._4_4_ * auVar211._4_4_;
    auVar70._0_4_ = auVar193._0_4_ * auVar211._0_4_;
    auVar70._8_4_ = auVar193._8_4_ * auVar211._8_4_;
    auVar70._12_4_ = auVar193._12_4_ * auVar211._12_4_;
    auVar70._16_4_ = auVar193._16_4_ * auVar211._16_4_;
    auVar70._20_4_ = auVar193._20_4_ * auVar211._20_4_;
    auVar70._24_4_ = auVar193._24_4_ * auVar211._24_4_;
    auVar70._28_4_ = 0x7f800000;
    auVar71._4_4_ = auVar193._4_4_ * auVar95._4_4_;
    auVar71._0_4_ = auVar193._0_4_ * auVar95._0_4_;
    auVar71._8_4_ = auVar193._8_4_ * auVar95._8_4_;
    auVar71._12_4_ = auVar193._12_4_ * auVar95._12_4_;
    auVar71._16_4_ = auVar193._16_4_ * auVar95._16_4_;
    auVar71._20_4_ = auVar193._20_4_ * auVar95._20_4_;
    auVar71._24_4_ = auVar193._24_4_ * auVar95._24_4_;
    auVar71._28_4_ = auVar158._28_4_;
    auVar72._4_4_ = auVar193._4_4_ * auVar52._4_4_;
    auVar72._0_4_ = auVar193._0_4_ * auVar52._0_4_;
    auVar72._8_4_ = auVar193._8_4_ * auVar52._8_4_;
    auVar72._12_4_ = auVar193._12_4_ * auVar52._12_4_;
    auVar72._16_4_ = auVar193._16_4_ * auVar52._16_4_;
    auVar72._20_4_ = auVar193._20_4_ * auVar52._20_4_;
    auVar72._24_4_ = auVar193._24_4_ * auVar52._24_4_;
    auVar72._28_4_ = 0;
    auVar73._4_4_ = fVar176 * local_260;
    auVar73._0_4_ = fVar172 * local_260;
    auVar73._8_4_ = fVar177 * local_260;
    auVar73._12_4_ = fVar178 * local_260;
    auVar73._16_4_ = fVar179 * local_260;
    auVar73._20_4_ = fVar180 * local_260;
    auVar73._24_4_ = fVar181 * local_260;
    auVar73._28_4_ = fVar152;
    auVar158 = vsubps_avx(auVar70,auVar73);
    auVar74._4_4_ = local_280 * fVar176;
    auVar74._0_4_ = local_280 * fVar172;
    auVar74._8_4_ = local_280 * fVar177;
    auVar74._12_4_ = local_280 * fVar178;
    auVar74._16_4_ = local_280 * fVar179;
    auVar74._20_4_ = local_280 * fVar180;
    auVar74._24_4_ = local_280 * fVar181;
    auVar74._28_4_ = fVar152;
    auVar174 = vsubps_avx(auVar71,auVar74);
    auVar75._4_4_ = fVar176 * local_2a0;
    auVar75._0_4_ = fVar172 * local_2a0;
    auVar75._8_4_ = fVar177 * local_2a0;
    auVar75._12_4_ = fVar178 * local_2a0;
    auVar75._16_4_ = fVar179 * local_2a0;
    auVar75._20_4_ = fVar180 * local_2a0;
    auVar75._24_4_ = fVar181 * local_2a0;
    auVar75._28_4_ = fVar152;
    auVar205 = vsubps_avx(auVar72,auVar75);
    auVar107._0_4_ =
         auVar158._0_4_ * auVar158._0_4_ +
         auVar174._0_4_ * auVar174._0_4_ + auVar205._0_4_ * auVar205._0_4_;
    auVar107._4_4_ =
         auVar158._4_4_ * auVar158._4_4_ +
         auVar174._4_4_ * auVar174._4_4_ + auVar205._4_4_ * auVar205._4_4_;
    auVar107._8_4_ =
         auVar158._8_4_ * auVar158._8_4_ +
         auVar174._8_4_ * auVar174._8_4_ + auVar205._8_4_ * auVar205._8_4_;
    auVar107._12_4_ =
         auVar158._12_4_ * auVar158._12_4_ +
         auVar174._12_4_ * auVar174._12_4_ + auVar205._12_4_ * auVar205._12_4_;
    auVar107._16_4_ =
         auVar158._16_4_ * auVar158._16_4_ +
         auVar174._16_4_ * auVar174._16_4_ + auVar205._16_4_ * auVar205._16_4_;
    auVar107._20_4_ =
         auVar158._20_4_ * auVar158._20_4_ +
         auVar174._20_4_ * auVar174._20_4_ + auVar205._20_4_ * auVar205._20_4_;
    auVar107._24_4_ =
         auVar158._24_4_ * auVar158._24_4_ +
         auVar174._24_4_ * auVar174._24_4_ + auVar205._24_4_ * auVar205._24_4_;
    auVar107._28_4_ = auVar158._28_4_ + auVar174._28_4_ + auVar205._28_4_;
    local_540._0_4_ = auVar96._0_4_;
    local_540._4_4_ = auVar96._4_4_;
    fStack_538 = auVar96._8_4_;
    fStack_534 = auVar96._12_4_;
    fStack_530 = auVar96._16_4_;
    fStack_52c = auVar96._20_4_;
    fStack_528 = auVar96._24_4_;
    uStack_524 = auVar96._28_4_;
    auVar76._4_4_ = fVar186 * (float)local_540._4_4_ * (float)local_540._4_4_;
    auVar76._0_4_ = fVar182 * (float)local_540._0_4_ * (float)local_540._0_4_;
    auVar76._8_4_ = fVar187 * fStack_538 * fStack_538;
    auVar76._12_4_ = fVar188 * fStack_534 * fStack_534;
    auVar76._16_4_ = fVar189 * fStack_530 * fStack_530;
    auVar76._20_4_ = fVar190 * fStack_52c * fStack_52c;
    auVar76._24_4_ = fVar191 * fStack_528 * fStack_528;
    auVar76._28_4_ = uStack_524;
    uVar92 = *(uint *)(ray + k * 4 + 0x80);
    auVar94 = vshufps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x30)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x30)),0);
    auVar158 = vandnps_avx(auVar133,auVar196);
    auVar174 = vcmpps_avx(auVar107,auVar76,1);
    auVar77._4_4_ = fVar143 * -fVar176;
    auVar77._0_4_ = fVar144 * -fVar172;
    auVar77._8_4_ = fVar147 * -fVar177;
    auVar77._12_4_ = fVar148 * -fVar178;
    auVar77._16_4_ = fVar149 * -fVar179;
    auVar77._20_4_ = fVar150 * -fVar180;
    auVar77._24_4_ = fVar151 * -fVar181;
    auVar77._28_4_ = local_2a0;
    auVar174 = vblendvps_avx(auVar128,auVar77,auVar174);
    auVar158 = vblendvps_avx(auVar128,auVar174,auVar158);
    auVar209 = vminps_avx(local_340,auVar158);
    auVar174 = vmaxps_avx(local_340,auVar158);
    auVar211 = vminps_avx(local_460,auVar209);
    auVar205 = vcmpps_avx(auVar211,auVar209,0);
    auVar158 = vcmpps_avx(auVar128,auVar174,0);
    auVar195._8_4_ = 0xff800000;
    auVar195._0_8_ = 0xff800000ff800000;
    auVar195._12_4_ = 0xff800000;
    auVar195._16_4_ = 0xff800000;
    auVar195._20_4_ = 0xff800000;
    auVar195._24_4_ = 0xff800000;
    auVar195._28_4_ = 0xff800000;
    auVar158 = vblendvps_avx(auVar174,auVar195,auVar158);
    auVar174 = vcmpps_avx(auVar209,auVar128,0);
    auVar174 = vblendvps_avx(auVar209,auVar195,auVar174);
    auVar174 = vblendvps_avx(auVar174,auVar158,auVar205);
    auVar129._16_16_ = auVar94;
    auVar129._0_16_ = auVar94;
    auVar134._0_4_ = fVar116 + auVar211._0_4_;
    auVar134._4_4_ = fVar122 + auVar211._4_4_;
    auVar134._8_4_ = fStack_5b8 + auVar211._8_4_;
    auVar134._12_4_ = fStack_5b4 + auVar211._12_4_;
    auVar134._16_4_ = fStack_5b0 + auVar211._16_4_;
    auVar134._20_4_ = fStack_5ac + auVar211._20_4_;
    auVar134._24_4_ = fStack_5a8 + auVar211._24_4_;
    auVar134._28_4_ = fStack_5a4 + auVar211._28_4_;
    auVar158 = vcmpps_avx(auVar129,auVar134,2);
    auStack_5d0 = auVar95._16_16_;
    local_5e0 = ZEXT416(uVar92);
    auVar94 = vshufps_avx(ZEXT416(uVar92),ZEXT416(uVar92),0);
    auVar156._16_16_ = auVar94;
    auVar156._0_16_ = auVar94;
    auVar205 = vcmpps_avx(auVar134,auVar156,2);
    auVar158 = vandps_avx(auVar205,auVar158);
    local_5a0 = vmaxps_avx(auVar184,auVar174);
    auVar174 = vcmpps_avx(auVar211,auVar128,4);
    auVar174 = vandps_avx(auVar174,auVar196);
    local_2e0 = vandps_avx(auVar158,auVar174);
    local_580._0_4_ = fVar116 + local_5a0._0_4_;
    local_580._4_4_ = fVar122 + local_5a0._4_4_;
    local_580._8_4_ = fStack_5b8 + local_5a0._8_4_;
    local_580._12_4_ = fStack_5b4 + local_5a0._12_4_;
    local_580._16_4_ = fStack_5b0 + local_5a0._16_4_;
    local_580._20_4_ = fStack_5ac + local_5a0._20_4_;
    local_580._24_4_ = fStack_5a8 + local_5a0._24_4_;
    local_580._28_4_ = fStack_5a4 + local_5a0._28_4_;
    auVar158 = vcmpps_avx(auVar129,local_580,2);
    auVar174 = vcmpps_avx(local_580,auVar156,2);
    auVar158 = vandps_avx(auVar174,auVar158);
    auVar174 = vcmpps_avx(auVar195,local_5a0,4);
    auVar174 = vandps_avx(auVar174,auVar196);
    local_300 = vandps_avx(auVar158,auVar174);
    local_320 = vorps_avx(local_2e0,local_300);
    if ((((((((local_320 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_320 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_320 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_320 >> 0x7f,0) != '\0') ||
          (local_320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_320 >> 0xbf,0) != '\0') ||
        (local_320 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_320[0x1f] < '\0') {
      auVar205 = vblendvps_avx(local_5a0,auVar211,local_2e0);
      auVar209 = vblendvps_avx(_local_480,auVar208,local_2e0);
      fVar153 = (float)local_440._0_4_ * fVar112 * fVar153;
      fVar123 = (float)local_440._4_4_ * fVar16 * fVar123;
      fVar161 = fStack_438 * fVar23 * fVar161;
      fVar162 = fStack_434 * fVar30 * fVar162;
      fVar163 = fStack_430 * fVar37 * fVar163;
      fVar164 = fStack_42c * fVar44 * fVar164;
      fVar165 = fStack_428 * fVar51 * fVar165;
      auVar212 = ZEXT3264(local_420);
      local_380._0_4_ = fVar101 * local_2c0;
      local_380._4_4_ = fVar115 * fStack_2bc;
      fStack_378 = fVar19 * fStack_2b8;
      fStack_374 = fVar26 * fStack_2b4;
      fStack_370 = fVar33 * fStack_2b0;
      fStack_36c = fVar40 * fStack_2ac;
      fStack_368 = fVar47 * fStack_2a8;
      register0x000014dc = 0;
      auVar158 = vcmpps_avx(local_460,auVar205,0);
      auVar174 = vcmpps_avx(auVar205,auVar184,0);
      auVar158 = vorps_avx(auVar158,auVar174);
      auVar158 = vandps_avx(auVar196,auVar158);
      auVar211 = vcmpps_avx(local_340,auVar205,0);
      auVar174 = vandps_avx(auVar196,auVar211);
      fVar112 = auVar205._0_4_;
      fVar16 = auVar205._4_4_;
      fVar23 = auVar205._8_4_;
      fVar30 = auVar205._12_4_;
      fVar37 = auVar205._16_4_;
      fVar44 = auVar205._20_4_;
      fVar51 = auVar205._24_4_;
      fStack_35c = fVar115 * fVar123;
      local_360 = fVar101 * fVar153;
      fStack_358 = fVar19 * fVar161;
      fStack_354 = fVar26 * fVar162;
      fStack_350 = fVar33 * fVar163;
      fStack_34c = fVar40 * fVar164;
      fStack_348 = fVar47 * fVar165;
      fStack_344 = auVar196._28_4_;
      auVar135._0_4_ = fVar101 * fVar153 + fVar130 * (local_260 * fVar112 + fVar111);
      auVar135._4_4_ = fVar115 * fVar123 + fVar137 * (local_260 * fVar16 + fVar15);
      auVar135._8_4_ = fVar19 * fVar161 + fVar138 * (local_260 * fVar23 + fVar22);
      auVar135._12_4_ = fVar26 * fVar162 + fVar139 * (local_260 * fVar30 + fVar29);
      auVar135._16_4_ = fVar33 * fVar163 + fVar140 * (local_260 * fVar37 + fVar36);
      auVar135._20_4_ = fVar40 * fVar164 + fVar141 * (local_260 * fVar44 + fVar43);
      auVar135._24_4_ = fVar47 * fVar165 + fVar142 * (local_260 * fVar51 + fVar50);
      auVar135._28_4_ = auVar196._28_4_ + auVar211._28_4_ + (float)local_600._28_4_;
      fVar101 = auVar209._0_4_;
      fVar111 = auVar209._4_4_;
      auVar78._4_4_ = (float)local_380._4_4_ * fVar111;
      auVar78._0_4_ = (float)local_380._0_4_ * fVar101;
      fVar115 = auVar209._8_4_;
      auVar78._8_4_ = fStack_378 * fVar115;
      fVar15 = auVar209._12_4_;
      auVar78._12_4_ = fStack_374 * fVar15;
      fVar22 = auVar209._16_4_;
      auVar78._16_4_ = fStack_370 * fVar22;
      fVar29 = auVar209._20_4_;
      auVar78._20_4_ = fStack_36c * fVar29;
      fVar36 = auVar209._24_4_;
      auVar78._24_4_ = fStack_368 * fVar36;
      auVar78._28_4_ = local_340._28_4_;
      auVar211 = vsubps_avx(auVar135,auVar78);
      local_c0._0_8_ = local_420._0_8_ ^ 0x8000000080000000;
      local_c0._8_4_ = -fVar19;
      local_c0._12_4_ = -fVar26;
      local_c0._16_4_ = -fVar33;
      local_c0._20_4_ = -fVar40;
      local_c0._24_4_ = -fVar47;
      local_c0._28_4_ = local_420._28_4_ ^ 0x80000000;
      auVar196 = vblendvps_avx(local_420,local_c0,auVar174);
      local_560 = vblendvps_avx(auVar196,auVar211,auVar158);
      auVar170 = ZEXT3264(local_3e0);
      fStack_84 = local_560._28_4_;
      local_a0 = fVar192 * fVar153;
      fStack_9c = fVar114 * fVar123;
      fStack_98 = fVar18 * fVar161;
      fStack_94 = fVar25 * fVar162;
      fStack_90 = fVar32 * fVar163;
      fStack_8c = fVar39 * fVar164;
      fStack_88 = fVar46 * fVar165;
      auVar136._0_4_ = fVar192 * fVar153 + fVar130 * (fVar110 + local_280 * fVar112);
      auVar136._4_4_ = fVar114 * fVar123 + fVar137 * (fVar14 + local_280 * fVar16);
      auVar136._8_4_ = fVar18 * fVar161 + fVar138 * (fVar21 + local_280 * fVar23);
      auVar136._12_4_ = fVar25 * fVar162 + fVar139 * (fVar28 + local_280 * fVar30);
      auVar136._16_4_ = fVar32 * fVar163 + fVar140 * (fVar35 + local_280 * fVar37);
      auVar136._20_4_ = fVar39 * fVar164 + fVar141 * (fVar42 + local_280 * fVar44);
      auVar136._24_4_ = fVar46 * fVar165 + fVar142 * (fVar49 + local_280 * fVar51);
      auVar136._28_4_ = fStack_84 + local_3e0._28_4_ + auVar211._28_4_;
      local_80 = fVar192 * local_2c0;
      fStack_7c = fVar114 * fStack_2bc;
      fStack_78 = fVar18 * fStack_2b8;
      fStack_74 = fVar25 * fStack_2b4;
      fStack_70 = fVar32 * fStack_2b0;
      fStack_6c = fVar39 * fStack_2ac;
      fStack_68 = fVar46 * fStack_2a8;
      fStack_64 = fStack_84;
      auVar79._4_4_ = fVar114 * fStack_2bc * fVar111;
      auVar79._0_4_ = fVar192 * local_2c0 * fVar101;
      auVar79._8_4_ = fVar18 * fStack_2b8 * fVar115;
      auVar79._12_4_ = fVar25 * fStack_2b4 * fVar15;
      auVar79._16_4_ = fVar32 * fStack_2b0 * fVar22;
      auVar79._20_4_ = fVar39 * fStack_2ac * fVar29;
      auVar79._24_4_ = fVar46 * fStack_2a8 * fVar36;
      auVar79._28_4_ = local_460._28_4_;
      auVar211 = vsubps_avx(auVar136,auVar79);
      local_120._0_8_ = local_3a0._0_8_ ^ 0x8000000080000000;
      local_120._8_4_ = -fVar18;
      local_120._12_4_ = -fVar25;
      local_120._16_4_ = -fVar32;
      local_120._20_4_ = -fVar39;
      local_120._24_4_ = -fVar46;
      local_120._28_4_ = -local_3a0._28_4_;
      auVar196 = vblendvps_avx(local_3a0,local_120,auVar174);
      local_1a0 = vblendvps_avx(auVar196,auVar211,auVar158);
      local_2c0 = fVar171 * local_2c0;
      fStack_2bc = fVar113 * fStack_2bc;
      fStack_2b8 = fVar17 * fStack_2b8;
      fStack_2b4 = fVar24 * fStack_2b4;
      fStack_2b0 = fVar31 * fStack_2b0;
      fStack_2ac = fVar38 * fStack_2ac;
      fStack_2a8 = fVar45 * fStack_2a8;
      local_e0 = fVar171 * fVar153;
      fStack_dc = fVar113 * fVar123;
      fStack_d8 = fVar17 * fVar161;
      fStack_d4 = fVar24 * fVar162;
      fStack_d0 = fVar31 * fVar163;
      fStack_cc = fVar38 * fVar164;
      fStack_c8 = fVar45 * fVar165;
      fStack_c4 = auVar196._28_4_;
      auVar157._0_4_ = fVar171 * fVar153 + fVar130 * (fVar109 + fVar112 * local_2a0);
      auVar157._4_4_ = fVar113 * fVar123 + fVar137 * (fVar13 + fVar16 * local_2a0);
      auVar157._8_4_ = fVar17 * fVar161 + fVar138 * (fVar20 + fVar23 * local_2a0);
      auVar157._12_4_ = fVar24 * fVar162 + fVar139 * (fVar27 + fVar30 * local_2a0);
      auVar157._16_4_ = fVar31 * fVar163 + fVar140 * (fVar34 + fVar37 * local_2a0);
      auVar157._20_4_ = fVar38 * fVar164 + fVar141 * (fVar41 + fVar44 * local_2a0);
      auVar157._24_4_ = fVar45 * fVar165 + fVar142 * (fVar48 + fVar51 * local_2a0);
      auVar157._28_4_ = auVar196._28_4_ + fVar54 + auVar94._12_4_;
      auVar211 = vrcpps_avx(_local_440);
      auVar80._4_4_ = fStack_2bc * fVar111;
      auVar80._0_4_ = local_2c0 * fVar101;
      auVar80._8_4_ = fStack_2b8 * fVar115;
      auVar80._12_4_ = fStack_2b4 * fVar15;
      auVar80._16_4_ = fStack_2b0 * fVar22;
      auVar80._20_4_ = fStack_2ac * fVar29;
      auVar80._24_4_ = fStack_2a8 * fVar36;
      auVar80._28_4_ = local_2a0;
      auVar95 = vsubps_avx(auVar157,auVar80);
      local_140._0_8_ = local_3c0._0_8_ ^ 0x8000000080000000;
      local_140._8_4_ = -fVar17;
      local_140._12_4_ = -fVar24;
      local_140._16_4_ = -fVar31;
      local_140._20_4_ = -fVar38;
      local_140._24_4_ = -fVar45;
      local_140._28_4_ = local_3c0._28_4_ ^ 0x80000000;
      auVar196 = vblendvps_avx(local_3c0,local_140,auVar174);
      local_180 = vblendvps_avx(auVar196,auVar95,auVar158);
      fVar171 = auVar211._0_4_;
      fVar192 = auVar211._4_4_;
      auVar81._4_4_ = (float)local_440._4_4_ * fVar192;
      auVar81._0_4_ = (float)local_440._0_4_ * fVar171;
      fVar153 = auVar211._8_4_;
      auVar81._8_4_ = fStack_438 * fVar153;
      fVar109 = auVar211._12_4_;
      auVar81._12_4_ = fStack_434 * fVar109;
      fVar110 = auVar211._16_4_;
      auVar81._16_4_ = fStack_430 * fVar110;
      fVar113 = auVar211._20_4_;
      auVar81._20_4_ = fStack_42c * fVar113;
      fVar114 = auVar211._24_4_;
      auVar81._24_4_ = fStack_428 * fVar114;
      auVar81._28_4_ = local_140._28_4_;
      auVar183._8_4_ = 0x3f800000;
      auVar183._0_8_ = 0x3f8000003f800000;
      auVar183._12_4_ = 0x3f800000;
      auVar183._16_4_ = 0x3f800000;
      auVar183._20_4_ = 0x3f800000;
      auVar183._24_4_ = 0x3f800000;
      auVar183._28_4_ = 0x3f800000;
      auVar196 = vsubps_avx(auVar183,auVar81);
      _local_440 = vblendvps_avx(auVar183,ZEXT832(0) << 0x20,auVar174);
      local_100._0_4_ = fVar171 + fVar171 * auVar196._0_4_;
      local_100._4_4_ = fVar192 + fVar192 * auVar196._4_4_;
      fStack_f8 = fVar153 + fVar153 * auVar196._8_4_;
      fStack_f4 = fVar109 + fVar109 * auVar196._12_4_;
      fStack_f0 = fVar110 + fVar110 * auVar196._16_4_;
      fStack_ec = fVar113 + fVar113 * auVar196._20_4_;
      fStack_e8 = fVar114 + fVar114 * auVar196._24_4_;
      register0x000012dc = auVar211._28_4_ + auVar196._28_4_;
      auVar82._4_4_ = fVar111 * (float)local_100._4_4_;
      auVar82._0_4_ = fVar101 * (float)local_100._0_4_;
      auVar82._8_4_ = fVar115 * fStack_f8;
      auVar82._12_4_ = fVar15 * fStack_f4;
      auVar82._16_4_ = fVar22 * fStack_f0;
      auVar82._20_4_ = fVar29 * fStack_ec;
      auVar82._24_4_ = fVar36 * fStack_e8;
      auVar82._28_4_ = auVar209._28_4_;
      local_220 = vblendvps_avx(_local_440,auVar82,auVar158);
      local_200 = ZEXT832(0) << 0x20;
      local_1e0._4_4_ = fVar16 + fVar122;
      local_1e0._0_4_ = fVar112 + fVar116;
      fStack_1d8 = fVar23 + fStack_5b8;
      fStack_1d4 = fVar30 + fStack_5b4;
      fStack_1d0 = fVar37 + fStack_5b0;
      fStack_1cc = fVar44 + fStack_5ac;
      fStack_1c8 = fVar51 + fStack_5a8;
      fStack_1c4 = auVar205._28_4_ + fStack_5a4;
      local_1c0 = local_560;
      uVar92 = vmovmskps_avx(local_320);
      uVar93 = (ulong)uVar92;
      local_5c0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar160 = ZEXT3264(local_3a0);
      auVar197 = ZEXT3264(local_3c0);
      auVar175 = ZEXT3264(local_3e0);
      auVar185 = ZEXT3264(local_400);
      auVar210 = ZEXT3264(local_600);
      auVar206 = ZEXT3264(local_580);
      local_638 = pSVar89;
      _local_540 = auVar184;
      fStack_2a4 = local_120._28_4_;
      fStack_29c = local_2a0;
      fStack_298 = local_2a0;
      fStack_294 = local_2a0;
      fStack_290 = local_2a0;
      fStack_28c = local_2a0;
      fStack_288 = local_2a0;
      fStack_284 = local_2a0;
      fStack_27c = local_280;
      fStack_278 = local_280;
      fStack_274 = local_280;
      fStack_270 = local_280;
      fStack_26c = local_280;
      fStack_268 = local_280;
      fStack_264 = local_280;
      fStack_25c = local_260;
      fStack_258 = local_260;
      fStack_254 = local_260;
      fStack_250 = local_260;
      fStack_24c = local_260;
      fStack_248 = local_260;
      fStack_244 = local_260;
      do {
        auVar158 = auVar160._0_32_;
        local_630.valid = (int *)local_650;
        auVar184 = auVar185._0_32_;
        auVar174 = auVar175._0_32_;
        auVar209 = auVar210._0_32_;
        fVar171 = auVar170._28_4_;
        auVar196 = auVar197._0_32_;
        auVar211 = auVar212._0_32_;
        auVar205 = auVar206._0_32_;
        uVar12 = 0;
        if (uVar93 != 0) {
          for (; (uVar93 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar92 = *(uint *)(local_240 + uVar12 * 4);
        pGVar9 = (pSVar89->geometries).items[uVar92].ptr;
        if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar91 = true, pRVar87 = ray, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00fce2c0;
          local_4e0 = *(undefined4 *)(local_220 + uVar12 * 4);
          uVar90 = *(undefined4 *)(local_200 + uVar12 * 4);
          local_4d0._4_4_ = uVar90;
          local_4d0._0_4_ = uVar90;
          local_4d0._8_4_ = uVar90;
          local_4d0._12_4_ = uVar90;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar12 * 4);
          local_630.context = context->user;
          local_4b0 = vpshufd_avx(ZEXT416(uVar92),0);
          uVar92 = (line->primIDs).field_0.i[uVar12];
          local_4c0._4_4_ = uVar92;
          local_4c0._0_4_ = uVar92;
          local_4c0._8_4_ = uVar92;
          local_4c0._12_4_ = uVar92;
          uVar90 = *(undefined4 *)(local_1c0 + uVar12 * 4);
          local_510._4_4_ = uVar90;
          local_510._0_4_ = uVar90;
          local_510._8_4_ = uVar90;
          local_510._12_4_ = uVar90;
          uVar90 = *(undefined4 *)(local_1a0 + uVar12 * 4);
          local_500._4_4_ = uVar90;
          local_500._0_4_ = uVar90;
          local_500._8_4_ = uVar90;
          local_500._12_4_ = uVar90;
          uVar90 = *(undefined4 *)(local_180 + uVar12 * 4);
          local_4f0._4_4_ = uVar90;
          local_4f0._0_4_ = uVar90;
          local_4f0._8_4_ = uVar90;
          local_4f0._12_4_ = uVar90;
          vcmpps_avx(ZEXT1632((undefined1  [16])0x0),ZEXT1632((undefined1  [16])0x0),0xf);
          uStack_49c = (local_630.context)->instID[0];
          local_4a0 = uStack_49c;
          uStack_498 = uStack_49c;
          uStack_494 = uStack_49c;
          uStack_490 = (local_630.context)->instPrimID[0];
          uStack_48c = uStack_490;
          uStack_488 = uStack_490;
          uStack_484 = uStack_490;
          local_650 = *local_5c0;
          local_630.geometryUserPtr = pGVar9->userPtr;
          local_630.hit = local_510;
          local_630.N = 4;
          local_630.ray = (RTCRayN *)ray;
          uStack_4dc = local_4e0;
          uStack_4d8 = local_4e0;
          uStack_4d4 = local_4e0;
          auVar94 = local_4d0;
          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar170 = ZEXT1664(auVar170._0_16_);
            local_640 = ray;
            (*pGVar9->occlusionFilterN)(&local_630);
            auVar206 = ZEXT3264(local_580);
            auVar212 = ZEXT3264(local_420);
            auVar210 = ZEXT3264(local_600);
            auVar185 = ZEXT3264(local_400);
            auVar175 = ZEXT3264(local_3e0);
            auVar197 = ZEXT3264(local_3c0);
            auVar160 = ZEXT3264(local_3a0);
            pSVar89 = local_638;
            ray = local_640;
          }
          if (local_650 == (undefined1  [16])0x0) {
            auVar102 = ZEXT816(0);
            auVar94 = vpcmpeqd_avx((undefined1  [16])0x0,auVar102);
            auVar102 = vpcmpeqd_avx(auVar102,auVar102);
            auVar94 = auVar94 ^ auVar102;
          }
          else {
            p_Var11 = context->args->filter;
            auVar102 = ZEXT816(0);
            auVar94 = vpcmpeqd_avx(auVar94,auVar94);
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              auVar170 = ZEXT1664(auVar170._0_16_);
              (*p_Var11)(&local_630);
              auVar94 = vpcmpeqd_avx(auVar94,auVar94);
              auVar102 = ZEXT816(0) << 0x40;
              auVar206 = ZEXT3264(local_580);
              auVar212 = ZEXT3264(local_420);
              auVar210 = ZEXT3264(local_600);
              auVar185 = ZEXT3264(local_400);
              auVar175 = ZEXT3264(local_3e0);
              auVar197 = ZEXT3264(local_3c0);
              auVar160 = ZEXT3264(local_3a0);
              pSVar89 = local_638;
            }
            auVar102 = vpcmpeqd_avx(local_650,auVar102);
            auVar94 = auVar102 ^ auVar94;
            auVar117._8_4_ = 0xff800000;
            auVar117._0_8_ = 0xff800000ff800000;
            auVar117._12_4_ = 0xff800000;
            auVar102 = vblendvps_avx(auVar117,*(undefined1 (*) [16])(local_630.ray + 0x80),auVar102)
            ;
            *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar102;
          }
          auVar158 = auVar160._0_32_;
          auVar184 = auVar185._0_32_;
          auVar174 = auVar175._0_32_;
          auVar209 = auVar210._0_32_;
          fVar171 = auVar170._28_4_;
          auVar196 = auVar197._0_32_;
          auVar211 = auVar212._0_32_;
          auVar205 = auVar206._0_32_;
          auVar102._8_8_ = 0x100000001;
          auVar102._0_8_ = 0x100000001;
          if ((auVar102 & auVar94) != (undefined1  [16])0x0) {
            local_5e0 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            bVar91 = true;
            pRVar87 = ray;
            goto LAB_00fce2c0;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = local_5e0._0_4_;
        }
        auVar158 = auVar160._0_32_;
        auVar184 = auVar185._0_32_;
        auVar174 = auVar175._0_32_;
        auVar209 = auVar210._0_32_;
        fVar171 = auVar170._28_4_;
        auVar196 = auVar197._0_32_;
        auVar211 = auVar212._0_32_;
        auVar205 = auVar206._0_32_;
        uVar93 = uVar93 ^ 1L << (uVar12 & 0x3f);
      } while (uVar93 != 0);
      bVar91 = false;
      pRVar87 = ray;
LAB_00fce2c0:
      local_640 = pRVar87;
      auVar95 = vandps_avx(local_300,local_2e0);
      auVar94 = vpermilps_avx(local_5e0,0);
      auVar108._16_16_ = auVar94;
      auVar108._0_16_ = auVar94;
      auVar96 = vcmpps_avx(auVar205,auVar108,2);
      auVar52 = auVar95 & auVar96;
      if ((((((((auVar52 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar52 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar52 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar52 >> 0x7f,0) == '\0') &&
            (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar52 >> 0xbf,0) == '\0') &&
          (auVar52 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar52[0x1f])
      {
        return bVar91;
      }
      local_560._0_8_ = line;
      auVar53 = vcmpps_avx(local_5a0,local_340,0);
      auVar211 = vblendvps_avx(auVar211,local_c0,auVar53);
      auVar52 = vblendvps_avx(auVar158,local_120,auVar53);
      auVar196 = vblendvps_avx(auVar196,local_140,auVar53);
      auVar53 = vcmpps_avx(local_5a0,local_460,0);
      auVar104 = vcmpps_avx(local_5a0,_local_540,0);
      auVar53 = vorps_avx(auVar53,auVar104);
      fVar192 = local_5a0._0_4_;
      fVar153 = local_5a0._4_4_;
      fVar101 = local_5a0._8_4_;
      fVar109 = local_5a0._12_4_;
      fVar110 = local_5a0._16_4_;
      fVar111 = local_5a0._20_4_;
      fVar112 = local_5a0._24_4_;
      auVar146._0_4_ = (float)local_160._0_4_ * (auVar209._0_4_ + fVar192 * local_260) + local_360;
      auVar146._4_4_ = (float)local_160._4_4_ * (auVar209._4_4_ + fVar153 * fStack_25c) + fStack_35c
      ;
      auVar146._8_4_ = fStack_158 * (auVar209._8_4_ + fVar101 * fStack_258) + fStack_358;
      auVar146._12_4_ = fStack_154 * (auVar209._12_4_ + fVar109 * fStack_254) + fStack_354;
      auVar146._16_4_ = fStack_150 * (auVar209._16_4_ + fVar110 * fStack_250) + fStack_350;
      auVar146._20_4_ = fStack_14c * (auVar209._20_4_ + fVar111 * fStack_24c) + fStack_34c;
      auVar146._24_4_ = fStack_148 * (auVar209._24_4_ + fVar112 * fStack_248) + fStack_348;
      auVar146._28_4_ = auVar209._28_4_ + auVar104._28_4_ + fStack_344;
      auVar159._0_4_ = (float)local_160._0_4_ * (auVar174._0_4_ + fVar192 * local_280) + local_a0;
      auVar159._4_4_ = (float)local_160._4_4_ * (auVar174._4_4_ + fVar153 * fStack_27c) + fStack_9c;
      auVar159._8_4_ = fStack_158 * (auVar174._8_4_ + fVar101 * fStack_278) + fStack_98;
      auVar159._12_4_ = fStack_154 * (auVar174._12_4_ + fVar109 * fStack_274) + fStack_94;
      auVar159._16_4_ = fStack_150 * (auVar174._16_4_ + fVar110 * fStack_270) + fStack_90;
      auVar159._20_4_ = fStack_14c * (auVar174._20_4_ + fVar111 * fStack_26c) + fStack_8c;
      auVar159._24_4_ = fStack_148 * (auVar174._24_4_ + fVar112 * fStack_268) + fStack_88;
      auVar159._28_4_ = auVar174._28_4_ + auVar158._28_4_ + fStack_84;
      auVar169._0_4_ = (float)local_160._0_4_ * (auVar184._0_4_ + fVar192 * local_2a0) + local_e0;
      auVar169._4_4_ = (float)local_160._4_4_ * (auVar184._4_4_ + fVar153 * fStack_29c) + fStack_dc;
      auVar169._8_4_ = fStack_158 * (auVar184._8_4_ + fVar101 * fStack_298) + fStack_d8;
      auVar169._12_4_ = fStack_154 * (auVar184._12_4_ + fVar109 * fStack_294) + fStack_d4;
      auVar169._16_4_ = fStack_150 * (auVar184._16_4_ + fVar110 * fStack_290) + fStack_d0;
      auVar169._20_4_ = fStack_14c * (auVar184._20_4_ + fVar111 * fStack_28c) + fStack_cc;
      auVar169._24_4_ = fStack_148 * (auVar184._24_4_ + fVar112 * fStack_288) + fStack_c8;
      auVar169._28_4_ = auVar184._28_4_ + fVar171 + fStack_c4;
      auVar83._4_4_ = (float)local_480._4_4_ * (float)local_380._4_4_;
      auVar83._0_4_ = (float)local_480._0_4_ * (float)local_380._0_4_;
      auVar83._8_4_ = fStack_478 * fStack_378;
      auVar83._12_4_ = fStack_474 * fStack_374;
      auVar83._16_4_ = fStack_470 * fStack_370;
      auVar83._20_4_ = fStack_46c * fStack_36c;
      auVar83._24_4_ = fStack_468 * fStack_368;
      auVar83._28_4_ = uStack_144;
      auVar158 = vsubps_avx(auVar146,auVar83);
      auVar84._4_4_ = (float)local_480._4_4_ * fStack_7c;
      auVar84._0_4_ = (float)local_480._0_4_ * local_80;
      auVar84._8_4_ = fStack_478 * fStack_78;
      auVar84._12_4_ = fStack_474 * fStack_74;
      auVar84._16_4_ = fStack_470 * fStack_70;
      auVar84._20_4_ = fStack_46c * fStack_6c;
      auVar84._24_4_ = fStack_468 * fStack_68;
      auVar84._28_4_ = uStack_144;
      auVar174 = vsubps_avx(auVar159,auVar84);
      auVar94._0_4_ = (float)local_480._0_4_ * local_2c0;
      auVar94._4_4_ = (float)local_480._4_4_ * fStack_2bc;
      auVar94._8_4_ = fStack_478 * fStack_2b8;
      auVar94._12_4_ = fStack_474 * fStack_2b4;
      auVar85._16_4_ = fStack_470 * fStack_2b0;
      auVar85._0_16_ = auVar94;
      auVar85._20_4_ = fStack_46c * fStack_2ac;
      auVar85._24_4_ = fStack_468 * fStack_2a8;
      auVar85._28_4_ = uStack_144;
      auVar184 = vsubps_avx(auVar169,auVar85);
      local_1c0 = vblendvps_avx(auVar211,auVar158,auVar53);
      local_1a0 = vblendvps_avx(auVar52,auVar174,auVar53);
      local_180 = vblendvps_avx(auVar196,auVar184,auVar53);
      auVar86._4_4_ = (float)local_480._4_4_ * (float)local_100._4_4_;
      auVar86._0_4_ = (float)local_480._0_4_ * (float)local_100._0_4_;
      auVar86._8_4_ = fStack_478 * fStack_f8;
      auVar86._12_4_ = fStack_474 * fStack_f4;
      auVar86._16_4_ = fStack_470 * fStack_f0;
      auVar86._20_4_ = fStack_46c * fStack_ec;
      auVar86._24_4_ = fStack_468 * fStack_e8;
      auVar86._28_4_ = auVar158._28_4_;
      local_220 = vblendvps_avx(_local_440,auVar86,auVar53);
      auVar158 = vandps_avx(auVar96,auVar95);
      auVar160 = ZEXT864(0) << 0x20;
      local_200 = ZEXT832(0) << 0x20;
      _local_1e0 = auVar205;
      pSVar89 = context->scene;
      uVar90 = vmovmskps_avx(auVar158);
      uVar93 = CONCAT44((int)((ulong)line >> 0x20),uVar90);
      auVar170 = ZEXT864(0) << 0x20;
      auVar94 = vpcmpeqd_avx(auVar94,auVar94);
      auVar175 = ZEXT1664(auVar94);
      do {
        local_630.valid = (int *)local_650;
        uVar12 = 0;
        if (uVar93 != 0) {
          for (; (uVar93 >> uVar12 & 1) == 0; uVar12 = uVar12 + 1) {
          }
        }
        uVar92 = *(uint *)(local_240 + uVar12 * 4);
        pGVar9 = (pSVar89->geometries).items[uVar92].ptr;
        if ((pGVar9->mask & *(uint *)(local_640 + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar88 = 1, pGVar9->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00fce6bb;
          local_4e0 = *(undefined4 *)(local_220 + uVar12 * 4);
          uVar90 = *(undefined4 *)(local_200 + uVar12 * 4);
          local_4d0._4_4_ = uVar90;
          local_4d0._0_4_ = uVar90;
          local_4d0._8_4_ = uVar90;
          local_4d0._12_4_ = uVar90;
          *(undefined4 *)(local_640 + k * 4 + 0x80) = *(undefined4 *)(local_1e0 + uVar12 * 4);
          local_630.context = context->user;
          local_4b0 = vpshufd_avx(ZEXT416(uVar92),0);
          uVar90 = *(undefined4 *)(local_560._0_8_ + 0x40 + uVar12 * 4);
          local_4c0._4_4_ = uVar90;
          local_4c0._0_4_ = uVar90;
          local_4c0._8_4_ = uVar90;
          local_4c0._12_4_ = uVar90;
          uVar90 = *(undefined4 *)(local_1c0 + uVar12 * 4);
          local_510._4_4_ = uVar90;
          local_510._0_4_ = uVar90;
          local_510._8_4_ = uVar90;
          local_510._12_4_ = uVar90;
          uVar90 = *(undefined4 *)(local_1a0 + uVar12 * 4);
          local_500._4_4_ = uVar90;
          local_500._0_4_ = uVar90;
          local_500._8_4_ = uVar90;
          local_500._12_4_ = uVar90;
          uVar90 = *(undefined4 *)(local_180 + uVar12 * 4);
          local_4f0._4_4_ = uVar90;
          local_4f0._0_4_ = uVar90;
          local_4f0._8_4_ = uVar90;
          local_4f0._12_4_ = uVar90;
          vcmpps_avx(auVar160._0_32_,auVar160._0_32_,0xf);
          uStack_49c = (local_630.context)->instID[0];
          local_4a0 = uStack_49c;
          uStack_498 = uStack_49c;
          uStack_494 = uStack_49c;
          uStack_490 = (local_630.context)->instPrimID[0];
          uStack_48c = uStack_490;
          uStack_488 = uStack_490;
          uStack_484 = uStack_490;
          local_650 = *local_5c0;
          local_630.geometryUserPtr = pGVar9->userPtr;
          local_630.hit = local_510;
          local_630.N = 4;
          local_630.ray = (RTCRayN *)local_640;
          uStack_4dc = local_4e0;
          uStack_4d8 = local_4e0;
          uStack_4d4 = local_4e0;
          if (pGVar9->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_600._0_8_ = k;
            auVar94 = auVar175._0_16_;
            (*pGVar9->occlusionFilterN)(&local_630);
            auVar94 = vpcmpeqd_avx(auVar94,auVar94);
            auVar175 = ZEXT1664(auVar94);
            auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar160 = ZEXT1664(ZEXT816(0) << 0x40);
            k = local_600._0_8_;
          }
          auVar94 = auVar175._0_16_;
          if (local_650 == (undefined1  [16])0x0) {
            auVar102 = vpcmpeqd_avx(auVar170._0_16_,(undefined1  [16])0x0);
            auVar94 = auVar94 ^ auVar102;
          }
          else {
            p_Var11 = context->args->filter;
            if ((p_Var11 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var11)(&local_630);
              auVar94 = vpcmpeqd_avx(auVar94,auVar94);
              auVar175 = ZEXT1664(auVar94);
              auVar170 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar160 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar102 = vpcmpeqd_avx(auVar170._0_16_,local_650);
            auVar94 = auVar175._0_16_ ^ auVar102;
            auVar118._8_4_ = 0xff800000;
            auVar118._0_8_ = 0xff800000ff800000;
            auVar118._12_4_ = 0xff800000;
            auVar102 = vblendvps_avx(auVar118,*(undefined1 (*) [16])(local_630.ray + 0x80),auVar102)
            ;
            *(undefined1 (*) [16])(local_630.ray + 0x80) = auVar102;
          }
          auVar103._8_8_ = 0x100000001;
          auVar103._0_8_ = 0x100000001;
          if ((auVar103 & auVar94) != (undefined1  [16])0x0) {
            bVar88 = 1;
            goto LAB_00fce6bb;
          }
          *(undefined4 *)(local_640 + k * 4 + 0x80) = local_5e0._0_4_;
        }
        uVar93 = uVar93 ^ 1L << (uVar12 & 0x3f);
        if (uVar93 == 0) {
          bVar88 = 0;
LAB_00fce6bb:
          return (bool)(bVar91 | bVar88);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }